

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

Addr CfgNode::node2addr(CfgNode *node)

{
  Type TVar1;
  Data *pDVar2;
  CfgNode *node_local;
  
  TVar1 = type(node);
  if (TVar1 == CFG_BLOCK || TVar1 == CFG_PHANTOM) {
    pDVar2 = data(node);
    if (pDVar2 == (Data *)0x0) {
      __assert_fail("node->data() != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                    ,0xcb,"static Addr CfgNode::node2addr(CfgNode *)");
    }
    pDVar2 = data(node);
    node_local = (CfgNode *)Data::addr(pDVar2);
  }
  else {
    node_local = (CfgNode *)0x0;
  }
  return (Addr)node_local;
}

Assistant:

Addr CfgNode::node2addr(CfgNode* node) {
	switch (node->type()) {
		case CfgNode::CFG_BLOCK:
		case CfgNode::CFG_PHANTOM:
			assert(node->data() != 0);
			return node->data()->addr();
		default:
			return 0;
	}
}